

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

int wally_elements_pegin_contract_script_from_bytes
              (uchar *redeem_script,size_t redeem_script_len,uchar *script,size_t script_len,
              uint32_t flags,uchar *bytes_out,size_t len,size_t *written)

{
  uchar uVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  secp256k1_context_struct *ctx;
  ulong __n;
  ulong uVar5;
  bool bVar6;
  uint uVar7;
  bool bVar8;
  size_t ser_len;
  size_t opcode_size;
  size_t size_out;
  secp256k1_pubkey *pub_key_combination [2];
  size_t push_size;
  secp256k1_pubkey pub_key_tweaked;
  uchar tweak [32];
  secp256k1_pubkey pub_key;
  uchar ser_pub_key [33];
  secp256k1_pubkey pub_key_combined;
  secp256k1_pubkey pub_key_from_tweak;
  uint local_1f4;
  uchar *local_1f0;
  size_t local_1d0;
  ulong local_1c8;
  uchar *local_1c0;
  size_t local_1b8;
  size_t local_1b0;
  size_t local_1a8;
  size_t local_1a0;
  secp256k1_pubkey *local_198;
  secp256k1_pubkey *local_190;
  size_t local_180;
  secp256k1_pubkey local_178;
  uchar local_138 [32];
  secp256k1_pubkey local_118;
  uchar local_d8 [40];
  secp256k1_pubkey local_b0;
  secp256k1_pubkey local_70;
  
  ctx = secp_ctx();
  local_1d0 = 0x21;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  uVar4 = 0xfffffffe;
  if ((((flags == 0) && (redeem_script != (uchar *)0x0)) && (redeem_script_len != 0)) &&
     (((script != (uchar *)0x0 && (script_len != 0)) &&
      ((bytes_out != (uchar *)0x0 && (len == redeem_script_len)))))) {
    bVar6 = false;
    local_1f0 = bytes_out;
    local_1b8 = script_len;
    local_1b0 = redeem_script_len;
    do {
      iVar3 = get_push_size(redeem_script,redeem_script_len,false,&local_1a0);
      if (iVar3 == 0) {
        uVar4 = get_push_size(redeem_script,redeem_script_len,true,&local_1a8);
        if (uVar4 == 0) {
          __n = local_1a8 + local_1a0;
          uVar5 = redeem_script_len - __n;
          if (redeem_script_len < __n) {
            uVar4 = 0xfffffffe;
            goto LAB_0017557e;
          }
          if ((local_1a0 != 0x21 || local_1a8 != 1) || (bVar6)) {
            memcpy(local_1f0,redeem_script,__n);
            uVar4 = local_1f4;
          }
          else {
            local_1c0 = redeem_script + 1;
            local_1c8 = __n;
            iVar3 = pubkey_parse(&local_118,local_1c0,0x21);
            uVar7 = 0xffffffff;
            uVar4 = uVar7;
            if (iVar3 == 0) {
LAB_001756f1:
              bVar8 = false;
            }
            else {
              local_178.data[0x30] = local_118.data[0x30];
              local_178.data[0x31] = local_118.data[0x31];
              local_178.data[0x32] = local_118.data[0x32];
              local_178.data[0x33] = local_118.data[0x33];
              local_178.data[0x34] = local_118.data[0x34];
              local_178.data[0x35] = local_118.data[0x35];
              local_178.data[0x36] = local_118.data[0x36];
              local_178.data[0x37] = local_118.data[0x37];
              local_178.data[0x38] = local_118.data[0x38];
              local_178.data[0x39] = local_118.data[0x39];
              local_178.data[0x3a] = local_118.data[0x3a];
              local_178.data[0x3b] = local_118.data[0x3b];
              local_178.data[0x3c] = local_118.data[0x3c];
              local_178.data[0x3d] = local_118.data[0x3d];
              local_178.data[0x3e] = local_118.data[0x3e];
              local_178.data[0x3f] = local_118.data[0x3f];
              local_178.data[0x20] = local_118.data[0x20];
              local_178.data[0x21] = local_118.data[0x21];
              local_178.data[0x22] = local_118.data[0x22];
              local_178.data[0x23] = local_118.data[0x23];
              local_178.data[0x24] = local_118.data[0x24];
              local_178.data[0x25] = local_118.data[0x25];
              local_178.data[0x26] = local_118.data[0x26];
              local_178.data[0x27] = local_118.data[0x27];
              local_178.data[0x28] = local_118.data[0x28];
              local_178.data[0x29] = local_118.data[0x29];
              local_178.data[0x2a] = local_118.data[0x2a];
              local_178.data[0x2b] = local_118.data[0x2b];
              local_178.data[0x2c] = local_118.data[0x2c];
              local_178.data[0x2d] = local_118.data[0x2d];
              local_178.data[0x2e] = local_118.data[0x2e];
              local_178.data[0x2f] = local_118.data[0x2f];
              local_178.data[0x10] = local_118.data[0x10];
              local_178.data[0x11] = local_118.data[0x11];
              local_178.data[0x12] = local_118.data[0x12];
              local_178.data[0x13] = local_118.data[0x13];
              local_178.data[0x14] = local_118.data[0x14];
              local_178.data[0x15] = local_118.data[0x15];
              local_178.data[0x16] = local_118.data[0x16];
              local_178.data[0x17] = local_118.data[0x17];
              local_178.data[0x18] = local_118.data[0x18];
              local_178.data[0x19] = local_118.data[0x19];
              local_178.data[0x1a] = local_118.data[0x1a];
              local_178.data[0x1b] = local_118.data[0x1b];
              local_178.data[0x1c] = local_118.data[0x1c];
              local_178.data[0x1d] = local_118.data[0x1d];
              local_178.data[0x1e] = local_118.data[0x1e];
              local_178.data[0x1f] = local_118.data[0x1f];
              local_178.data[0] = local_118.data[0];
              local_178.data[1] = local_118.data[1];
              local_178.data[2] = local_118.data[2];
              local_178.data[3] = local_118.data[3];
              local_178.data[4] = local_118.data[4];
              local_178.data[5] = local_118.data[5];
              local_178.data[6] = local_118.data[6];
              local_178.data[7] = local_118.data[7];
              local_178.data[8] = local_118.data[8];
              local_178.data[9] = local_118.data[9];
              local_178.data[10] = local_118.data[10];
              local_178.data[0xb] = local_118.data[0xb];
              local_178.data[0xc] = local_118.data[0xc];
              local_178.data[0xd] = local_118.data[0xd];
              local_178.data[0xe] = local_118.data[0xe];
              local_178.data[0xf] = local_118.data[0xf];
              uVar4 = wally_hmac_sha256(local_1c0,0x21,script,local_1b8,local_138,0x20);
              if (uVar4 == 0) {
                iVar3 = secp256k1_ec_pubkey_tweak_add(ctx,&local_178,local_138);
                uVar4 = uVar7;
                if ((((iVar3 != 0) &&
                     (iVar3 = pubkey_serialize(local_d8,&local_1d0,&local_178,0x102), iVar3 != 0))
                    && (uVar4 = wally_script_push_from_bytes
                                          (local_d8,local_1d0,0,local_1f0,redeem_script_len,
                                           &local_180), uVar4 == 0)) &&
                   ((iVar3 = secp256k1_ec_pubkey_create(ctx,&local_70,local_138), uVar4 = uVar7,
                    iVar3 != 0 && (iVar3 = pubkey_negate(&local_118), iVar3 != 0)))) {
                  local_198 = &local_118;
                  local_190 = &local_178;
                  iVar3 = pubkey_combine(&local_b0,&local_198,2);
                  if (iVar3 != 0) {
                    iVar3 = bcmp(&local_b0,&local_70,0x40);
                    bVar8 = iVar3 == 0;
                    uVar4 = -(uint)(iVar3 != 0) | local_1f4;
                    goto LAB_001756f3;
                  }
                }
                goto LAB_001756f1;
              }
              bVar8 = false;
            }
LAB_001756f3:
            __n = local_1c8;
            if (!bVar8) goto LAB_0017557e;
          }
          redeem_script = redeem_script + __n;
          local_1f0 = local_1f0 + __n;
          bVar8 = true;
        }
        else {
LAB_0017557e:
          bVar8 = false;
          uVar5 = redeem_script_len;
        }
        cVar2 = '\x01';
        redeem_script_len = uVar5;
        local_1f4 = uVar4;
        if (bVar8) goto LAB_00175596;
      }
      else {
        uVar1 = *redeem_script;
        if (uVar1 == 'g') {
          bVar6 = true;
        }
        redeem_script = redeem_script + 1;
        *local_1f0 = uVar1;
        local_1f0 = local_1f0 + 1;
        uVar5 = redeem_script_len - 1;
LAB_00175596:
        cVar2 = (uVar5 == 0) * '\x02';
        redeem_script_len = uVar5;
      }
    } while (cVar2 == '\0');
    uVar4 = local_1f4;
    if (cVar2 == '\x02') {
      if (written != (size_t *)0x0) {
        *written = local_1b0;
      }
      uVar4 = 0;
    }
  }
  return uVar4;
}

Assistant:

int wally_elements_pegin_contract_script_from_bytes(const unsigned char *redeem_script,
                                                    size_t redeem_script_len,
                                                    const unsigned char *script,
                                                    size_t script_len,
                                                    uint32_t flags,
                                                    unsigned char *bytes_out,
                                                    size_t len,
                                                    size_t *written)
{
    unsigned char ser_pub_key[EC_PUBLIC_KEY_LEN];
    const secp256k1_context *ctx = secp_ctx();
    const unsigned char *p = redeem_script;
    unsigned char *q = bytes_out;
    size_t bytes_len = redeem_script_len;
    size_t ser_len = EC_PUBLIC_KEY_LEN;
    /* For liquidv1 initial watchman template, don't tweak emergency keys. in the future, use flags to change watchmen template */
    bool op_else_found = false;

    int ret;

    if (written)
        *written = 0;

    if (!redeem_script || !redeem_script_len || !script ||
        !script_len || flags || !bytes_out || len != redeem_script_len)
        return WALLY_EINVAL;

    for (;;) {
        size_t size_out;
        ret = script_get_push_size_from_bytes(p, bytes_len, &size_out);
        if (ret == WALLY_OK) {
            size_t offset_siz;
            size_t opcode_size;

            if ((ret = script_get_push_opcode_size_from_bytes(p, bytes_len, &opcode_size)) != WALLY_OK)
                return ret;

            offset_siz = size_out + opcode_size;
            if (bytes_len < offset_siz)
                return WALLY_EINVAL;

            if (opcode_size == 1 && size_out == EC_PUBLIC_KEY_LEN && !op_else_found) {
                unsigned char tweak[HMAC_SHA256_LEN];
                secp256k1_pubkey pub_key;
                secp256k1_pubkey pub_key_from_tweak;
                secp256k1_pubkey pub_key_tweaked;
                const secp256k1_pubkey *pub_key_combination[2];
                secp256k1_pubkey pub_key_combined;
                size_t push_size;

                if (!pubkey_parse(&pub_key, p + 1, EC_PUBLIC_KEY_LEN))
                    return WALLY_ERROR;
                memcpy(&pub_key_tweaked, &pub_key, sizeof(pub_key));
                if ((ret = wally_hmac_sha256(p + 1, EC_PUBLIC_KEY_LEN, script, script_len, tweak, HMAC_SHA256_LEN)) != WALLY_OK)
                    return ret;
                if (!pubkey_tweak_add(ctx, &pub_key_tweaked, tweak))
                    return WALLY_ERROR;
                if (!pubkey_serialize(ser_pub_key, &ser_len, &pub_key_tweaked, PUBKEY_COMPRESSED))
                    return WALLY_ERROR;
                if ((ret = wally_script_push_from_bytes(ser_pub_key, ser_len, 0, q, bytes_len, &push_size)) != WALLY_OK)
                    return ret;
                /* sanity checks as per elementsd */
                if (!pubkey_create(ctx, &pub_key_from_tweak, tweak))
                    return WALLY_ERROR;
                if (!pubkey_negate(&pub_key))
                    return WALLY_ERROR;

                pub_key_combination[0] = &pub_key;
                pub_key_combination[1] = &pub_key_tweaked;
                if (!pubkey_combine(&pub_key_combined, pub_key_combination, 2))
                    return WALLY_ERROR;
                if (memcmp(&pub_key_combined, &pub_key_from_tweak, sizeof(secp256k1_pubkey)) != 0)
                    return WALLY_ERROR;
            }
            else
                memcpy(q, p, offset_siz);
            p += offset_siz;
            q += offset_siz;
            bytes_len -= offset_siz;
        } else {
            if (*p == OP_ELSE && flags == 0) {
                op_else_found = true;
            }

            *q++ = *p++;
            --bytes_len;
        }
        if (bytes_len == 0)
            break;
    }

    if (written)
        *written = redeem_script_len;

    return WALLY_OK;
}